

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QWidget *parent)

{
  Scroller *pSVar1;
  DateTimePickerPrivate *this_00;
  undefined4 *puVar2;
  code *local_60;
  ImplFn local_58;
  code *local_50;
  undefined8 local_48;
  QObject local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00194788;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_00194938;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QDateTime);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  pSVar1 = ((this->d).d)->scroller;
  local_50 = Scroller::aboutToStart;
  local_48 = 0;
  local_60 = _q_scrollAboutToStart;
  local_58 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar2 + 4) = _q_scrollAboutToStart;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_30,(void **)pSVar1,(QObject *)&local_50,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  pSVar1 = ((this->d).d)->scroller;
  local_50 = Scroller::scroll;
  local_48 = 0;
  local_60 = _q_scroll;
  local_58 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::DateTimePicker::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = _q_scroll;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pSVar1,(QObject *)&local_50,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pSVar1 = ((this->d).d)->scroller;
  local_50 = Scroller::finished;
  local_48 = 0;
  local_60 = _q_scrollFinished;
  local_58 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar2 + 4) = _q_scrollFinished;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pSVar1,(QObject *)&local_50,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDateTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}